

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpanel_bmod.c
# Opt level: O1

void cpanel_bmod(int m,int w,int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  flops_t *pfVar13;
  int *piVar14;
  int *piVar15;
  int_t *piVar16;
  int_t *piVar17;
  void *pvVar18;
  int_t *piVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  float *pfVar29;
  int *piVar30;
  singlecomplex *psVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int nrow;
  long lVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  singlecomplex *psVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  ulong uVar45;
  singlecomplex *psVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  int local_17c;
  
  pfVar13 = stat->ops;
  piVar14 = Glu->xsup;
  piVar15 = Glu->supno;
  piVar16 = Glu->lsub;
  piVar17 = Glu->xlsub;
  pvVar18 = Glu->lusup;
  piVar19 = Glu->xlusup;
  iVar20 = sp_ienv(3);
  iVar21 = sp_ienv(7);
  iVar20 = sp_ienv((uint)(iVar20 <= iVar21) * 4 + 3);
  iVar21 = sp_ienv(4);
  iVar22 = sp_ienv(5);
  if (0 < nseg) {
    iVar23 = iVar21 + iVar20;
    iVar42 = jcol + w;
    uVar37 = (ulong)(uint)nseg;
    iVar32 = 0;
    do {
      iVar9 = segrep[uVar37 - 1];
      iVar10 = piVar14[piVar15[iVar9]];
      iVar38 = iVar9 - iVar10;
      iVar34 = iVar38 + 1;
      iVar11 = piVar17[iVar10];
      iVar24 = piVar17[(long)iVar10 + 1] - iVar11;
      nrow = iVar24 - iVar34;
      local_17c = iVar11 + iVar38 + 1;
      iVar25 = iVar11 + iVar38;
      if ((iVar34 < iVar22) || (nrow <= iVar21)) {
        if (0 < w) {
          lVar28 = (long)local_17c;
          piVar30 = repfnz;
          psVar40 = dense;
          iVar27 = jcol;
          do {
            iVar35 = piVar30[iVar9];
            if (iVar35 != -1) {
              ncol = (iVar9 - iVar35) + 1;
              iVar44 = piVar19[iVar10];
              pfVar13[0x13] = (float)(int)((iVar9 - iVar35) * ncol * 4) + pfVar13[0x13];
              pfVar13[0x14] = (float)(int)(nrow * 8 * ncol) + pfVar13[0x14];
              if (iVar9 == iVar35) {
                iVar35 = piVar17[(long)iVar10 + 1];
                if (local_17c < iVar35) {
                  fVar50 = psVar40[piVar16[iVar25]].r;
                  fVar51 = psVar40[piVar16[iVar25]].i;
                  pfVar29 = (float *)((long)pvVar18 +
                                     (long)(iVar44 + iVar38 * iVar24 + iVar34) * 8 + 4);
                  lVar33 = lVar28;
                  do {
                    iVar44 = piVar16[lVar33];
                    fVar49 = pfVar29[-1];
                    fVar1 = *pfVar29;
                    fVar47 = psVar40[iVar44].i;
                    psVar40[iVar44].r = psVar40[iVar44].r - (fVar50 * fVar49 + fVar1 * -fVar51);
                    psVar40[iVar44].i = fVar47 - (fVar49 * fVar51 + fVar1 * fVar50);
                    lVar33 = lVar33 + 1;
                    pfVar29 = pfVar29 + 2;
                  } while (lVar33 < iVar35);
                }
              }
              else if (iVar9 - iVar35 < 3) {
                iVar35 = piVar16[iVar25];
                iVar44 = iVar44 + (iVar24 + 1) * iVar38;
                iVar26 = piVar16[(long)iVar25 + -1];
                fVar50 = psVar40[iVar26].r;
                fVar51 = psVar40[iVar26].i;
                lVar33 = (long)(iVar44 - iVar24);
                if (ncol == 2) {
                  fVar49 = *(float *)((long)pvVar18 + lVar33 * 8);
                  fVar1 = *(float *)((long)pvVar18 + lVar33 * 8 + 4);
                  fVar47 = psVar40[iVar35].r - (fVar50 * fVar49 - fVar1 * fVar51);
                  fVar49 = psVar40[iVar35].i - (fVar49 * fVar51 + fVar1 * fVar50);
                  psVar40[iVar35].r = fVar47;
                  psVar40[iVar35].i = fVar49;
                  iVar35 = piVar17[(long)iVar10 + 1];
                  if (local_17c < iVar35) {
                    lVar36 = 0;
                    do {
                      iVar26 = piVar16[lVar28 + lVar36];
                      fVar1 = *(float *)((long)pvVar18 + lVar36 * 8 + (long)iVar44 * 8 + 8);
                      fVar2 = *(float *)((long)pvVar18 + lVar36 * 8 + (long)iVar44 * 8 + 0xc);
                      fVar3 = *(float *)((long)pvVar18 + lVar36 * 8 + lVar33 * 8 + 8);
                      fVar4 = *(float *)((long)pvVar18 + lVar36 * 8 + lVar33 * 8 + 0xc);
                      fVar48 = psVar40[iVar26].i;
                      psVar40[iVar26].r =
                           psVar40[iVar26].r -
                           (fVar50 * fVar3 + fVar4 * -fVar51 + fVar47 * fVar1 + fVar2 * -fVar49);
                      psVar40[iVar26].i =
                           fVar48 - (fVar3 * fVar51 + fVar4 * fVar50 +
                                    fVar1 * fVar49 + fVar2 * fVar47);
                      lVar39 = lVar28 + lVar36;
                      lVar36 = lVar36 + 1;
                    } while (lVar39 + 1 < (long)iVar35);
                  }
                }
                else {
                  fVar49 = psVar40[piVar16[(long)iVar25 + -2]].r;
                  fVar1 = psVar40[piVar16[(long)iVar25 + -2]].i;
                  lVar36 = (long)((iVar44 - iVar24) - iVar24);
                  fVar47 = *(float *)((long)pvVar18 + lVar36 * 8 + -8);
                  fVar2 = *(float *)((long)pvVar18 + lVar36 * 8 + -4);
                  fVar50 = fVar50 - (fVar49 * fVar47 - fVar2 * fVar1);
                  fVar51 = fVar51 - (fVar47 * fVar1 + fVar2 * fVar49);
                  fVar47 = *(float *)((long)pvVar18 + lVar33 * 8);
                  fVar2 = *(float *)((long)pvVar18 + lVar33 * 8 + 4);
                  fVar3 = *(float *)((long)pvVar18 + lVar36 * 8);
                  fVar4 = *(float *)((long)pvVar18 + lVar36 * 8 + 4);
                  fVar48 = psVar40[iVar35].r -
                           ((fVar49 * fVar3 - fVar4 * fVar1) + (fVar50 * fVar47 - fVar2 * fVar51));
                  fVar47 = psVar40[iVar35].i -
                           (fVar3 * fVar1 + fVar4 * fVar49 + fVar47 * fVar51 + fVar2 * fVar50);
                  psVar40[iVar35].r = fVar48;
                  psVar40[iVar35].i = fVar47;
                  psVar40[iVar26].r = fVar50;
                  psVar40[iVar26].i = fVar51;
                  iVar35 = piVar17[(long)iVar10 + 1];
                  if (local_17c < iVar35) {
                    lVar36 = lVar33 * 8 + (long)iVar24 * -8 + 0xc;
                    lVar39 = 0;
                    do {
                      iVar26 = piVar16[lVar28 + lVar39];
                      fVar2 = *(float *)((long)pvVar18 + lVar39 * 8 + (long)iVar44 * 8 + 8);
                      fVar3 = *(float *)((long)pvVar18 + lVar39 * 8 + (long)iVar44 * 8 + 0xc);
                      fVar4 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar33 * 8 + 8);
                      fVar5 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar33 * 8 + 0xc);
                      fVar6 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar36 + -4);
                      fVar7 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar36);
                      fVar8 = psVar40[iVar26].i;
                      psVar40[iVar26].r =
                           psVar40[iVar26].r -
                           (fVar49 * fVar6 + fVar7 * -fVar1 +
                           fVar50 * fVar4 + fVar5 * -fVar51 + fVar48 * fVar2 + fVar3 * -fVar47);
                      psVar40[iVar26].i =
                           fVar8 - (fVar6 * fVar1 + fVar7 * fVar49 +
                                   fVar4 * fVar51 + fVar5 * fVar50 + fVar2 * fVar47 + fVar3 * fVar48
                                   );
                      lVar41 = lVar28 + lVar39;
                      lVar39 = lVar39 + 1;
                    } while (lVar41 + 1 < (long)iVar35);
                  }
                }
              }
              else {
                uVar45 = (ulong)(uint)((iVar9 + 1) - iVar35);
                iVar26 = (iVar35 - iVar10) + iVar11;
                uVar43 = 0;
                do {
                  tempv[uVar43] = psVar40[piVar16[(long)iVar26 + uVar43]];
                  uVar43 = uVar43 + 1;
                } while (uVar45 != uVar43);
                iVar44 = iVar44 + (iVar35 - iVar10) * (iVar24 + 1);
                clsolve(iVar24,ncol,(singlecomplex *)((long)pvVar18 + (long)iVar44 * 8),tempv);
                psVar31 = tempv + ncol;
                cmatvec(iVar24,nrow,ncol,
                        (singlecomplex *)((long)pvVar18 + (long)(int)(iVar44 + ncol) * 8),tempv,
                        psVar31);
                uVar43 = 0;
                iVar35 = iVar26;
                do {
                  psVar40[piVar16[(long)iVar26 + uVar43]] = tempv[uVar43];
                  tempv[uVar43].r = 0.0;
                  tempv[uVar43].i = 0.0;
                  uVar43 = uVar43 + 1;
                  iVar35 = iVar35 + 1;
                } while (uVar45 != uVar43);
                if (0 < nrow) {
                  lVar33 = 0;
                  do {
                    iVar44 = piVar16[iVar35 + lVar33];
                    fVar50 = psVar40[iVar44].i;
                    psVar40[iVar44].r = psVar40[iVar44].r - psVar31[lVar33].r;
                    psVar40[iVar44].i = fVar50 - psVar31[lVar33].i;
                    psVar31[lVar33].r = 0.0;
                    psVar31[lVar33].i = 0.0;
                    lVar33 = lVar33 + 1;
                  } while (lVar33 < nrow);
                }
              }
            }
            iVar27 = iVar27 + 1;
            piVar30 = piVar30 + m;
            psVar40 = psVar40 + m;
          } while (iVar27 < iVar42);
        }
      }
      else {
        if (0 < w) {
          lVar28 = (long)local_17c;
          psVar31 = tempv;
          piVar30 = repfnz;
          psVar40 = dense;
          iVar27 = jcol;
          do {
            iVar35 = piVar30[iVar9];
            if (iVar35 != -1) {
              iVar44 = (iVar9 - iVar35) + 1;
              iVar26 = piVar19[iVar10];
              pfVar13[0x13] = (float)((iVar9 - iVar35) * iVar44 * 4) + pfVar13[0x13];
              pfVar13[0x14] = (float)(nrow * 8 * iVar44) + pfVar13[0x14];
              if (iVar9 == iVar35) {
                iVar35 = piVar17[(long)iVar10 + 1];
                if (local_17c < iVar35) {
                  fVar50 = psVar40[piVar16[iVar25]].r;
                  fVar51 = psVar40[piVar16[iVar25]].i;
                  pfVar29 = (float *)((long)pvVar18 +
                                     (long)(iVar26 + iVar38 * iVar24 + iVar34) * 8 + 4);
                  lVar33 = lVar28;
                  do {
                    iVar44 = piVar16[lVar33];
                    fVar49 = pfVar29[-1];
                    fVar1 = *pfVar29;
                    fVar47 = psVar40[iVar44].i;
                    psVar40[iVar44].r = psVar40[iVar44].r - (fVar50 * fVar49 + fVar1 * -fVar51);
                    psVar40[iVar44].i = fVar47 - (fVar49 * fVar51 + fVar1 * fVar50);
                    lVar33 = lVar33 + 1;
                    pfVar29 = pfVar29 + 2;
                  } while (lVar33 < iVar35);
                }
              }
              else if (iVar9 - iVar35 < 3) {
                iVar35 = piVar16[iVar25];
                iVar12 = piVar16[(long)iVar25 + -1];
                fVar50 = psVar40[iVar12].r;
                fVar51 = psVar40[iVar12].i;
                iVar26 = iVar26 + (iVar24 + 1) * iVar38;
                lVar33 = (long)(iVar26 - iVar24);
                if (iVar44 == 2) {
                  fVar49 = *(float *)((long)pvVar18 + lVar33 * 8);
                  fVar1 = *(float *)((long)pvVar18 + lVar33 * 8 + 4);
                  fVar47 = psVar40[iVar35].r - (fVar50 * fVar49 - fVar1 * fVar51);
                  fVar49 = psVar40[iVar35].i - (fVar49 * fVar51 + fVar1 * fVar50);
                  psVar40[iVar35].r = fVar47;
                  psVar40[iVar35].i = fVar49;
                  iVar35 = piVar17[(long)iVar10 + 1];
                  if (local_17c < iVar35) {
                    lVar36 = 0;
                    do {
                      iVar44 = piVar16[lVar28 + lVar36];
                      fVar1 = *(float *)((long)pvVar18 + lVar36 * 8 + (long)iVar26 * 8 + 8);
                      fVar2 = *(float *)((long)pvVar18 + lVar36 * 8 + (long)iVar26 * 8 + 0xc);
                      fVar3 = *(float *)((long)pvVar18 + lVar36 * 8 + lVar33 * 8 + 8);
                      fVar4 = *(float *)((long)pvVar18 + lVar36 * 8 + lVar33 * 8 + 0xc);
                      fVar48 = psVar40[iVar44].i;
                      psVar40[iVar44].r =
                           psVar40[iVar44].r -
                           (fVar50 * fVar3 + fVar4 * -fVar51 + fVar47 * fVar1 + fVar2 * -fVar49);
                      psVar40[iVar44].i =
                           fVar48 - (fVar3 * fVar51 + fVar4 * fVar50 +
                                    fVar1 * fVar49 + fVar2 * fVar47);
                      lVar39 = lVar28 + lVar36;
                      lVar36 = lVar36 + 1;
                    } while (lVar39 + 1 < (long)iVar35);
                  }
                }
                else {
                  fVar49 = psVar40[piVar16[(long)iVar25 + -2]].r;
                  fVar1 = psVar40[piVar16[(long)iVar25 + -2]].i;
                  lVar36 = (long)((iVar26 - iVar24) - iVar24);
                  fVar47 = *(float *)((long)pvVar18 + lVar36 * 8 + -8);
                  fVar2 = *(float *)((long)pvVar18 + lVar36 * 8 + -4);
                  fVar50 = fVar50 - (fVar49 * fVar47 - fVar2 * fVar1);
                  fVar51 = fVar51 - (fVar47 * fVar1 + fVar2 * fVar49);
                  fVar47 = *(float *)((long)pvVar18 + lVar33 * 8);
                  fVar2 = *(float *)((long)pvVar18 + lVar33 * 8 + 4);
                  fVar3 = *(float *)((long)pvVar18 + lVar36 * 8);
                  fVar4 = *(float *)((long)pvVar18 + lVar36 * 8 + 4);
                  fVar48 = psVar40[iVar35].r -
                           ((fVar49 * fVar3 - fVar4 * fVar1) + (fVar50 * fVar47 - fVar2 * fVar51));
                  fVar47 = psVar40[iVar35].i -
                           (fVar3 * fVar1 + fVar4 * fVar49 + fVar47 * fVar51 + fVar2 * fVar50);
                  psVar40[iVar35].r = fVar48;
                  psVar40[iVar35].i = fVar47;
                  psVar40[iVar12].r = fVar50;
                  psVar40[iVar12].i = fVar51;
                  iVar35 = piVar17[(long)iVar10 + 1];
                  if (local_17c < iVar35) {
                    lVar36 = lVar33 * 8 + (long)iVar24 * -8 + 0xc;
                    lVar39 = 0;
                    do {
                      iVar44 = piVar16[lVar28 + lVar39];
                      fVar2 = *(float *)((long)pvVar18 + lVar39 * 8 + (long)iVar26 * 8 + 8);
                      fVar3 = *(float *)((long)pvVar18 + lVar39 * 8 + (long)iVar26 * 8 + 0xc);
                      fVar4 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar33 * 8 + 8);
                      fVar5 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar33 * 8 + 0xc);
                      fVar6 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar36 + -4);
                      fVar7 = *(float *)((long)pvVar18 + lVar39 * 8 + lVar36);
                      fVar8 = psVar40[iVar44].i;
                      psVar40[iVar44].r =
                           psVar40[iVar44].r -
                           (fVar49 * fVar6 + fVar7 * -fVar1 +
                           fVar50 * fVar4 + fVar5 * -fVar51 + fVar48 * fVar2 + fVar3 * -fVar47);
                      psVar40[iVar44].i =
                           fVar8 - (fVar6 * fVar1 + fVar7 * fVar49 +
                                   fVar4 * fVar51 + fVar5 * fVar50 + fVar2 * fVar47 + fVar3 * fVar48
                                   );
                      lVar41 = lVar28 + lVar39;
                      lVar39 = lVar39 + 1;
                    } while (lVar41 + 1 < (long)iVar35);
                  }
                }
              }
              else {
                uVar43 = 0;
                do {
                  psVar31[uVar43] = psVar40[piVar16[(long)(iVar11 + (iVar35 - iVar10)) + uVar43]];
                  uVar43 = uVar43 + 1;
                } while ((uint)((iVar9 + 1) - iVar35) != uVar43);
                clsolve(iVar24,iVar44,
                        (singlecomplex *)
                        ((long)pvVar18 + (long)(iVar26 + (iVar35 - iVar10) * (iVar24 + 1)) * 8),
                        psVar31);
              }
            }
            iVar27 = iVar27 + 1;
            piVar30 = piVar30 + m;
            psVar40 = psVar40 + m;
            psVar31 = psVar31 + iVar23;
          } while (iVar27 < iVar42);
        }
        if (0 < nrow) {
          iVar25 = 0;
          do {
            iVar27 = iVar25 + iVar21;
            iVar38 = iVar27;
            if (nrow < iVar27) {
              iVar38 = nrow;
            }
            iVar35 = iVar38 - iVar25;
            if (iVar21 < iVar38 - iVar25) {
              iVar35 = iVar21;
            }
            if (0 < w) {
              iVar38 = piVar19[iVar10];
              piVar30 = repfnz;
              psVar31 = dense;
              psVar46 = tempv + iVar20;
              psVar40 = tempv;
              iVar44 = jcol;
              do {
                iVar26 = piVar30[iVar9];
                if (((iVar26 != -1) && (2 < iVar9 - iVar26)) &&
                   (cmatvec(iVar24,iVar35,(iVar9 - iVar26) + 1,
                            (singlecomplex *)
                            ((long)pvVar18 +
                            (long)((iVar26 - iVar10) * iVar24 + iVar25 + iVar34 + iVar38) * 8),
                            psVar40,psVar40 + iVar20), 0 < iVar35)) {
                  lVar28 = 0;
                  do {
                    iVar26 = piVar16[local_17c + lVar28];
                    fVar50 = psVar31[iVar26].i;
                    psVar31[iVar26].r = psVar31[iVar26].r - psVar46[lVar28].r;
                    psVar31[iVar26].i = fVar50 - psVar46[lVar28].i;
                    psVar46[lVar28].r = 0.0;
                    psVar46[lVar28].i = 0.0;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 < iVar35);
                }
                iVar44 = iVar44 + 1;
                piVar30 = piVar30 + m;
                psVar31 = psVar31 + m;
                psVar40 = psVar40 + iVar23;
                psVar46 = psVar46 + iVar23;
              } while (iVar44 < iVar42);
            }
            local_17c = local_17c + iVar21;
            iVar25 = iVar27;
          } while (iVar27 < nrow);
        }
        if (0 < w) {
          psVar31 = tempv;
          piVar30 = repfnz;
          psVar40 = dense;
          iVar24 = jcol;
          do {
            iVar25 = piVar30[iVar9];
            if ((iVar25 != -1) && (2 < iVar9 - iVar25)) {
              uVar43 = 0;
              do {
                psVar40[piVar16[(long)((iVar11 - iVar10) + iVar25) + uVar43]] = psVar31[uVar43];
                psVar31[uVar43].r = 0.0;
                psVar31[uVar43].i = 0.0;
                uVar43 = uVar43 + 1;
              } while ((uint)((iVar9 + 1) - iVar25) != uVar43);
            }
            iVar24 = iVar24 + 1;
            piVar30 = piVar30 + m;
            psVar40 = psVar40 + m;
            psVar31 = psVar31 + iVar23;
          } while (iVar24 < iVar42);
        }
      }
      uVar37 = uVar37 - 1;
      iVar32 = iVar32 + 1;
    } while (iVar32 != nseg);
  }
  return;
}

Assistant:

void
cpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    singlecomplex     *dense,     /* out, of size n by w */
	    singlecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    singlecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    singlecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    singlecomplex       *dense_col;  /* dense[] for a column in the panel */
    singlecomplex       *tempv1;             /* Used in 1-D update */
    singlecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    clsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    cgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    cmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    clsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    cmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}